

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkAttachBottom(Abc_Ntk_t *pNtkTop,Abc_Ntk_t *pNtkBottom)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar4;
  int local_48;
  int local_44;
  int k;
  int i;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pBuffer;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkBottom_local;
  Abc_Ntk_t *pNtkTop_local;
  
  if (pNtkBottom == (Abc_Ntk_t *)0x0) {
    __assert_fail("pNtkBottom != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                  ,0x330,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  pNtkTop_local = pNtkBottom;
  if (pNtkTop != (Abc_Ntk_t *)0x0) {
    iVar1 = Abc_NtkPiNum(pNtkTop);
    iVar2 = Abc_NtkCiNum(pNtkTop);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkPiNum(pNtkTop) == Abc_NtkCiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x334,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    iVar1 = Abc_NtkPiNum(pNtkBottom);
    iVar2 = Abc_NtkCiNum(pNtkBottom);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) == Abc_NtkCiNum(pNtkBottom)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x335,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    iVar1 = Abc_NtkPoNum(pNtkBottom);
    iVar2 = Abc_NtkPiNum(pNtkTop);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkPoNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x337,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    iVar1 = Abc_NtkPiNum(pNtkBottom);
    iVar2 = Abc_NtkPiNum(pNtkTop);
    if (iVar2 <= iVar1) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) < Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x338,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    for (local_44 = 0; iVar1 = Abc_NtkPiNum(pNtkTop), local_44 < iVar1; local_44 = local_44 + 1) {
      pAVar3 = Abc_NtkPi(pNtkTop,local_44);
      pAVar4 = Abc_NtkCreateNodeBuf(pNtkTop,(Abc_Obj_t *)0x0);
      Abc_ObjTransferFanout(pAVar3,pAVar4);
      pAVar3 = Abc_NtkPo(pNtkBottom,local_44);
      (pAVar3->field_6).pCopy = pAVar4;
    }
    local_44 = Abc_NtkPiNum(pNtkTop);
    while( true ) {
      local_44 = local_44 + -1;
      iVar1 = Abc_NtkPiNum(pNtkBottom);
      if (local_44 < iVar1) break;
      pAVar3 = Abc_NtkPi(pNtkTop,local_44);
      Abc_NtkDeleteObj(pAVar3);
    }
    iVar1 = Abc_NtkPiNum(pNtkBottom);
    iVar2 = Abc_NtkPiNum(pNtkTop);
    if (iVar1 != iVar2) {
      __assert_fail("Abc_NtkPiNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcNtk.c"
                    ,0x343,"Abc_Ntk_t *Abc_NtkAttachBottom(Abc_Ntk_t *, Abc_Ntk_t *)");
    }
    for (local_44 = 0; iVar1 = Abc_NtkPiNum(pNtkBottom), local_44 < iVar1; local_44 = local_44 + 1)
    {
      Abc_NtkPi(pNtkBottom,local_44);
      pAVar3 = Abc_NtkPi(pNtkTop,local_44);
      pAVar4 = Abc_NtkPi(pNtkBottom,local_44);
      (pAVar4->field_6).pCopy = pAVar3;
    }
    p = Abc_NtkDfs(pNtkBottom,0);
    for (local_44 = 0; iVar1 = Vec_PtrSize(p), local_44 < iVar1; local_44 = local_44 + 1) {
      pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p,local_44);
      Abc_NtkDupObj(pNtkTop,pAVar3,0);
      for (local_48 = 0; iVar1 = Abc_ObjFaninNum(pAVar3), local_48 < iVar1; local_48 = local_48 + 1)
      {
        pAVar4 = Abc_ObjFanin(pAVar3,local_48);
        Abc_ObjAddFanin((pAVar3->field_6).pCopy,(pAVar4->field_6).pCopy);
      }
    }
    Vec_PtrFree(p);
    for (local_44 = 0; iVar1 = Abc_NtkPoNum(pNtkBottom), local_44 < iVar1; local_44 = local_44 + 1)
    {
      pAVar4 = Abc_NtkPo(pNtkBottom,local_44);
      pAVar3 = (pAVar4->field_6).pCopy;
      pAVar4 = Abc_ObjFanin0(pAVar4);
      Abc_ObjAddFanin(pAVar3,(pAVar4->field_6).pCopy);
    }
    Abc_NtkDelete(pNtkBottom);
    iVar1 = Abc_NtkCheck(pNtkTop);
    pNtkTop_local = pNtkTop;
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkAttachBottom(): Network check has failed.\n");
    }
  }
  return pNtkTop_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkAttachBottom( Abc_Ntk_t * pNtkTop, Abc_Ntk_t * pNtkBottom )
{
    Abc_Obj_t * pObj, * pFanin, * pBuffer;
    Vec_Ptr_t * vNodes;
    int i, k;
    assert( pNtkBottom != NULL );
    if ( pNtkTop == NULL )
        return pNtkBottom;
    // make sure the networks are combinational
    assert( Abc_NtkPiNum(pNtkTop) == Abc_NtkCiNum(pNtkTop) );
    assert( Abc_NtkPiNum(pNtkBottom) == Abc_NtkCiNum(pNtkBottom) );
    // make sure the POs of the bottom correspond to the PIs of the top
    assert( Abc_NtkPoNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop) );
    assert( Abc_NtkPiNum(pNtkBottom) <  Abc_NtkPiNum(pNtkTop) );
    // add buffers for the PIs of the top - save results in the POs of the bottom
    Abc_NtkForEachPi( pNtkTop, pObj, i )
    {
        pBuffer = Abc_NtkCreateNodeBuf( pNtkTop, NULL );
        Abc_ObjTransferFanout( pObj, pBuffer );
        Abc_NtkPo(pNtkBottom, i)->pCopy = pBuffer;
    }
    // remove useless PIs of the top
    for ( i = Abc_NtkPiNum(pNtkTop) - 1; i >= Abc_NtkPiNum(pNtkBottom); i-- )
        Abc_NtkDeleteObj( Abc_NtkPi(pNtkTop, i) );
    assert( Abc_NtkPiNum(pNtkBottom) == Abc_NtkPiNum(pNtkTop) );
    // copy the bottom network
    Abc_NtkForEachPi( pNtkBottom, pObj, i )
        Abc_NtkPi(pNtkBottom, i)->pCopy = Abc_NtkPi(pNtkTop, i);
    // construct all nodes
    vNodes = Abc_NtkDfs( pNtkBottom, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Abc_NtkDupObj(pNtkTop, pObj, 0);
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    }
    Vec_PtrFree( vNodes );
    // connect the POs
    Abc_NtkForEachPo( pNtkBottom, pObj, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_ObjFanin0(pObj)->pCopy );
    // delete old network
    Abc_NtkDelete( pNtkBottom );
    // return the network
    if ( !Abc_NtkCheck( pNtkTop ) )
        fprintf( stdout, "Abc_NtkAttachBottom(): Network check has failed.\n" );
    return pNtkTop;
}